

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O1

void QuestUnserialize(string *serialized,Character *character)

{
  undefined2 uVar1;
  pointer pcVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  _Rb_tree_header *p_Var6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  pointer pbVar9;
  char cVar10;
  pair<std::_Rb_tree_iterator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>,_bool>
  pVar11;
  pair<std::_Rb_tree_iterator<Character_QuestState>,_bool> pVar12;
  shared_ptr<Quest_Context> quest_context;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> part;
  Character_QuestState state;
  Quest *quest;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  Character *local_100;
  short local_f8;
  undefined6 uStack_f6;
  Quest_Context *local_f0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *ap_Stack_e8 [2];
  Quest_Context *local_d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_d0;
  long *local_c8 [2];
  long local_b8 [2];
  undefined1 local_a8 [8];
  string local_a0;
  const_iterator local_80;
  char *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  ulong local_60;
  pointer local_58;
  _Base_ptr local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_100 = character;
  util::explode(&local_48,';',serialized);
  local_58 = local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_60 = 0;
    pbVar9 = local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_c8[0] = local_b8;
      pcVar2 = (pbVar9->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_c8,pcVar2,pcVar2 + pbVar9->_M_string_length);
      cVar10 = (char)(string *)local_c8;
      lVar4 = std::__cxx11::string::find(cVar10,0x2c);
      if (lVar4 != -1) {
        lVar4 = std::__cxx11::string::find(cVar10,0x2c);
        local_a0._M_dataplus._M_p = local_a8 + 0x18;
        local_a0._M_string_length = 0;
        local_a0.field_2._M_local_buf[0] = '\0';
        local_80._M_current = (char *)&local_70;
        local_78 = (char *)0x0;
        local_70._M_local_buf[0] = '\0';
        std::__cxx11::string::substr((ulong)&local_f8,(ulong)local_c8);
        iVar3 = util::to_int((string *)&local_f8);
        local_a8._0_2_ = (undefined2)iVar3;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)CONCAT62(uStack_f6,local_f8) !=
            ap_Stack_e8) {
          operator_delete((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                          CONCAT62(uStack_f6,local_f8),
                          (ulong)((long)&ap_Stack_e8[0]->_vptr__Sp_counted_base + 1));
        }
        if (lVar4 == -1) {
          std::__cxx11::string::find((char)local_c8,0x3b);
          std::__cxx11::string::substr((ulong)&local_f8,(ulong)local_c8);
          std::__cxx11::string::operator=((string *)(local_a8 + 8),(string *)&local_f8);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)CONCAT62(uStack_f6,local_f8) !=
              ap_Stack_e8) {
            operator_delete((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                            CONCAT62(uStack_f6,local_f8),
                            (ulong)((long)&ap_Stack_e8[0]->_vptr__Sp_counted_base + 1));
          }
LAB_0011320c:
          pcVar5 = (char *)std::__cxx11::string::_M_replace((ulong)&local_80,0,local_78,0x1a416e);
LAB_00113230:
          if ((local_60 & 1) == 0) {
            local_60 = CONCAT71((int7)((ulong)pcVar5 >> 8),1);
            Console::Wrn("Converting quests from old format...");
          }
        }
        else {
          std::__cxx11::string::substr((ulong)&local_f8,(ulong)local_c8);
          std::__cxx11::string::operator=((string *)(local_a8 + 8),(string *)&local_f8);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)CONCAT62(uStack_f6,local_f8) !=
              ap_Stack_e8) {
            operator_delete((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                            CONCAT62(uStack_f6,local_f8),
                            (ulong)((long)&ap_Stack_e8[0]->_vptr__Sp_counted_base + 1));
          }
          std::__cxx11::string::substr((ulong)&local_f8,(ulong)local_c8);
          std::__cxx11::string::operator=((string *)&local_80,(string *)&local_f8);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)CONCAT62(uStack_f6,local_f8) !=
              ap_Stack_e8) {
            operator_delete((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                            CONCAT62(uStack_f6,local_f8),
                            (ulong)((long)&ap_Stack_e8[0]->_vptr__Sp_counted_base + 1));
          }
          pcVar5 = local_78;
          if (local_78 == (char *)0x0) goto LAB_00113230;
          if (*local_80._M_current != '{') {
            Console::Wrn("State progress counter reset for quest: %i");
            goto LAB_0011320c;
          }
          if (local_78 == (char *)0x0) goto LAB_00113230;
        }
        p_Var6 = &(local_100->world->quests)._M_t._M_impl.super__Rb_tree_header;
        p_Var8 = (local_100->world->quests)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var7 = &p_Var6->_M_header;
        for (; p_Var8 != (_Base_ptr)0x0;
            p_Var8 = (&p_Var8->_M_left)[(short)uVar1 < (short)local_a8._0_2_]) {
          uVar1 = (undefined2)p_Var8[1]._M_color;
          if ((short)local_a8._0_2_ <= (short)uVar1) {
            p_Var7 = p_Var8;
          }
        }
        p_Var8 = &p_Var6->_M_header;
        if (((_Rb_tree_header *)p_Var7 != p_Var6) &&
           (p_Var8 = p_Var7, (short)local_a8._0_2_ < (short)p_Var7[1]._M_color)) {
          p_Var8 = &p_Var6->_M_header;
        }
        if ((_Rb_tree_header *)p_Var8 == p_Var6) {
          Console::Wrn("Quest not found: %i. Marking as inactive.",
                       (ulong)(uint)(int)(short)local_a8._0_2_);
          pVar12 = std::
                   _Rb_tree<Character_QuestState,_Character_QuestState,_std::_Identity<Character_QuestState>,_std::less<Character_QuestState>,_std::allocator<Character_QuestState>_>
                   ::_M_insert_unique<Character_QuestState>
                             (&(local_100->quests_inactive)._M_t,(Character_QuestState *)local_a8);
          if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            Console::Wrn("Duplicate inactive quest record dropped for quest: %i",
                         (ulong)(uint)(int)(short)local_a8._0_2_);
          }
        }
        else {
          local_50 = p_Var8[1]._M_parent;
          local_d8 = (Quest_Context *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<Quest_Context,std::allocator<Quest_Context>,Character*&,Quest*&>
                    (&_Stack_d0,&local_d8,(allocator<Quest_Context> *)&local_f8,&local_100,
                     (Quest **)&local_50);
          EOPlus::Context::SetState(&local_d8->super_Context,(string *)(local_a8 + 8),false);
          Quest_Context::UnserializeProgress
                    (local_d8,local_80,(const_iterator)(local_78 + local_80._M_current));
          local_f8 = local_a8._0_2_;
          local_f0 = local_d8;
          ap_Stack_e8[0] = _Stack_d0._M_pi;
          local_d8 = (Quest_Context *)0x0;
          _Stack_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          pVar11 = std::
                   _Rb_tree<short,std::pair<short_const,std::shared_ptr<Quest_Context>>,std::_Select1st<std::pair<short_const,std::shared_ptr<Quest_Context>>>,std::less<short>,std::allocator<std::pair<short_const,std::shared_ptr<Quest_Context>>>>
                   ::_M_emplace_unique<std::pair<short,std::shared_ptr<Quest_Context>>>
                             ((_Rb_tree<short,std::pair<short_const,std::shared_ptr<Quest_Context>>,std::_Select1st<std::pair<short_const,std::shared_ptr<Quest_Context>>>,std::less<short>,std::allocator<std::pair<short_const,std::shared_ptr<Quest_Context>>>>
                               *)&local_100->quests,
                              (pair<short,_std::shared_ptr<Quest_Context>_> *)&local_f8);
          if (ap_Stack_e8[0] != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(ap_Stack_e8[0]);
          }
          if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            Console::Wrn("Duplicate quest record dropped for quest: %i",
                         (ulong)(uint)(int)(short)local_a8._0_2_);
          }
          if (_Stack_d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_d0._M_pi);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_current != &local_70) {
          operator_delete(local_80._M_current,
                          CONCAT71(local_70._M_allocated_capacity._1_7_,local_70._M_local_buf[0]) +
                          1);
        }
        if (local_a0._M_dataplus._M_p != local_a8 + 0x18) {
          operator_delete(local_a0._M_dataplus._M_p,
                          CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                                   local_a0.field_2._M_local_buf[0]) + 1);
        }
      }
      if (local_c8[0] != local_b8) {
        operator_delete(local_c8[0],local_b8[0] + 1);
      }
      pbVar9 = pbVar9 + 1;
    } while (pbVar9 != local_58);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void QuestUnserialize(std::string serialized, Character* character)
{
	bool conversion_warned = false;

	std::vector<std::string> parts = util::explode(';', serialized);

	UTIL_FOREACH(parts, part)
	{
		std::size_t pp1 = part.find_first_of(',');

		if (pp1 == std::string::npos)
			continue;

		std::size_t pp2 = part.find_first_of(',', pp1 + 1);

		Character_QuestState state;
		state.quest_id = util::to_int(part.substr(0, pp1));

		bool conversion_needed = false;

		if (pp2 != std::string::npos)
		{
			state.quest_state = part.substr(pp1 + 1, pp2 - pp1 - 1);
			state.quest_progress = part.substr(pp2 + 1);

			if (!state.quest_progress.empty() && state.quest_progress[0] != '{')
			{
				conversion_needed = true;

				// We could peek at the quest state for a possible matching rule here,
				// but it would greatly complicate the unserialization code.
				Console::Wrn("State progress counter reset for quest: %i", state.quest_id);
				state.quest_progress = "{}";
			}
			else if (state.quest_progress.empty())
			{
				conversion_needed = true;
			}
		}
		else
		{
			pp2 = part.find_first_of(';', pp1 + 1);

			if (pp2 == std::string::npos)
				pp2 = part.length() + 1;

			state.quest_state = part.substr(pp1 + 1, pp2 - pp1 - 1);
			state.quest_progress = "{}";

			conversion_needed = true;
		}

		if (conversion_needed)
		{
			if (!conversion_warned)
			{
				Console::Wrn("Converting quests from old format...");
				conversion_warned = true;
			}

			// Vodka leaves the quest state set to the end of the quest, which
			// means everyone will get stuck in an unfinished state
		}

		auto quest_it = character->world->quests.find(state.quest_id);

		if (quest_it == character->world->quests.end())
		{
			Console::Wrn("Quest not found: %i. Marking as inactive.", state.quest_id);

			// Store it in a non-activate state so we don't have to delete the data
			if (!character->quests_inactive.insert(std::move(state)).second)
				Console::Wrn("Duplicate inactive quest record dropped for quest: %i", state.quest_id);

			continue;
		}

		// WARNING: holds a non-tracked reference to shared_ptr
		Quest* quest = quest_it->second.get();
		auto quest_context(std::make_shared<Quest_Context>(character, quest));

		try
		{
			quest_context->SetState(state.quest_state, false);
			quest_context->UnserializeProgress(UTIL_CRANGE(state.quest_progress));
		}
		catch (EOPlus::Runtime_Error& ex)
		{
			Console::Wrn(ex.what());
			Console::Wrn("Could not resume quest: %i. Marking as inactive.", state.quest_id);

			if (!character->quests_inactive.insert(std::move(state)).second)
				Console::Wrn("Duplicate inactive quest record dropped for quest: %i", state.quest_id);

			continue;
		}

		auto result = character->quests.insert(std::make_pair(state.quest_id, std::move(quest_context)));

		if (!result.second)
		{
			Console::Wrn("Duplicate quest record dropped for quest: %i", state.quest_id);
			continue;
		}
	}
}